

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O1

float ExUtilGetFloat(char *v,int *error)

{
  char *pcVar1;
  float fVar2;
  double dVar3;
  char *end;
  char *local_18;
  
  local_18 = (char *)0x0;
  if (v == (char *)0x0) {
    fVar2 = 0.0;
  }
  else {
    dVar3 = strtod(v,&local_18);
    fVar2 = (float)dVar3;
  }
  if (((error != (int *)0x0) && (local_18 == v)) && (*error == 0)) {
    *error = 1;
    pcVar1 = "(null)";
    if (v != (char *)0x0) {
      pcVar1 = v;
    }
    fprintf(_stderr,"Error! \'%s\' is not a floating point number.\n",pcVar1);
  }
  return fVar2;
}

Assistant:

float ExUtilGetFloat(const char* const v, int* const error) {
  char* end = NULL;
  const float f = (v != NULL) ? (float)strtod(v, &end) : 0.f;
  if (end == v && error != NULL && !*error) {
    *error = 1;
    fprintf(stderr, "Error! '%s' is not a floating point number.\n",
            (v != NULL) ? v : "(null)");
  }
  return f;
}